

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

parasail_matrix_t *
parasail_matrix_create_internal(char *alphabet,int match,int mismatch,int case_sensitive)

{
  long lVar1;
  int *piVar2;
  byte bVar3;
  __int32_t *p_Var4;
  __int32_t *p_Var5;
  int iVar6;
  size_t __n;
  int *piVar7;
  int *piVar8;
  __int32_t **pp_Var9;
  char *__dest;
  parasail_matrix_t *ppVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  size_t sVar15;
  
  if (alphabet == (char *)0x0) {
    parasail_matrix_create_internal_cold_4();
  }
  else {
    __n = strlen(alphabet);
    if (__n < 0x7fffffff) {
      lVar1 = __n + 1;
      sVar15 = lVar1 * lVar1 * 4;
      piVar7 = (int *)malloc(sVar15);
      if (piVar7 == (int *)0x0) {
LAB_004b4507:
        fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_matrix_create_internal",sVar15)
        ;
        return (parasail_matrix_t *)0x0;
      }
      if (__n == 0) {
        lVar12 = 0;
      }
      else {
        sVar15 = 0;
        lVar13 = 0;
        do {
          lVar14 = 0;
          lVar12 = lVar13 * 4 + 4;
          do {
            lVar11 = lVar12;
            iVar6 = mismatch;
            if (sVar15 + lVar14 == 0) {
              iVar6 = match;
            }
            *(int *)((long)piVar7 + lVar11 + -4) = iVar6;
            lVar12 = lVar11 + 4;
            lVar14 = lVar14 + -1;
          } while (__n + lVar14 != 0);
          lVar13 = (lVar13 - lVar14) + 1;
          *(undefined4 *)((long)piVar7 + lVar11) = 0;
          sVar15 = sVar15 + 1;
        } while (sVar15 != __n);
      }
      memset((void *)((long)piVar7 + lVar12),0,__n * 4 + 4);
      piVar8 = (int *)malloc(0x400);
      if (piVar8 == (int *)0x0) {
        parasail_matrix_create_internal_cold_2();
      }
      else {
        iVar6 = (int)__n;
        lVar12 = 0;
        do {
          piVar2 = piVar8 + lVar12;
          *piVar2 = iVar6;
          piVar2[1] = iVar6;
          piVar2[2] = iVar6;
          piVar2[3] = iVar6;
          lVar12 = lVar12 + 4;
        } while (lVar12 != 0x100);
        if (case_sensitive == 0) {
          if (__n != 0) {
            pp_Var9 = __ctype_toupper_loc();
            p_Var4 = *pp_Var9;
            pp_Var9 = __ctype_tolower_loc();
            p_Var5 = *pp_Var9;
            sVar15 = 0;
            do {
              bVar3 = alphabet[sVar15];
              piVar8[p_Var4[bVar3]] = (int)sVar15;
              piVar8[p_Var5[bVar3]] = (int)sVar15;
              sVar15 = sVar15 + 1;
            } while (__n != sVar15);
          }
        }
        else if (__n != 0) {
          sVar15 = 0;
          do {
            piVar8[(byte)alphabet[sVar15]] = (int)sVar15;
            sVar15 = sVar15 + 1;
          } while (__n != sVar15);
        }
        sVar15 = __n + 2;
        __dest = (char *)malloc(sVar15);
        if (__dest == (char *)0x0) goto LAB_004b4507;
        memcpy(__dest,alphabet,__n);
        (__dest + __n)[0] = '*';
        (__dest + __n)[1] = '\0';
        ppVar10 = (parasail_matrix_t *)malloc(0x48);
        if (ppVar10 != (parasail_matrix_t *)0x0) {
          ppVar10->name = "";
          ppVar10->matrix = piVar7;
          ppVar10->mapper = piVar8;
          ppVar10->size = (int)lVar1;
          iVar6 = mismatch;
          if (mismatch < match) {
            iVar6 = match;
          }
          ppVar10->max = iVar6;
          if (match < mismatch) {
            mismatch = match;
          }
          ppVar10->min = mismatch;
          ppVar10->user_matrix = piVar7;
          ppVar10->type = 0;
          ppVar10->length = (int)lVar1;
          ppVar10->alphabet = __dest;
          ppVar10->query = (char *)0x0;
          return ppVar10;
        }
        parasail_matrix_create_internal_cold_1();
      }
    }
    else {
      parasail_matrix_create_internal_cold_3();
    }
  }
  return (parasail_matrix_t *)0x0;
}

Assistant:

static parasail_matrix_t* parasail_matrix_create_internal(
        const char *alphabet, const int match, const int mismatch, int case_sensitive)
{
    parasail_matrix_t *retval = NULL;
    int *matrix = NULL;
    int *mapper = NULL;
    char *alphabet_copy = NULL;
    size_t size = 0;
    size_t size1 = 0;
    size_t i = 0;
    size_t j = 0;
    size_t c = 0;

    PARASAIL_CHECK_NULL(alphabet);

    size = strlen(alphabet);
    if (size >= INT_MAX) {
        fprintf(stderr, "%s: alphabet is too large\n", __func__);
        return NULL;
    }
    size1 = size + 1;

    PARASAIL_CALLOC(matrix, int, size1*size1);

    for (i=0; i<size; ++i) {
        for (j=0; j<size; ++j) {
            if (i == j) {
                matrix[c++] = match;
            }
            else {
                matrix[c++] = mismatch;
            }
        }
        matrix[c++] = 0;
    }
    for (j=0; j<size1; ++j) {
        matrix[c++] = 0;
    }

    PARASAIL_CALLOC(mapper, int, 256);
    parasail_memset_int(mapper, (int)size, 256);
    if (case_sensitive) {
        for (i=0; i<size; ++i) {
            mapper[(unsigned char)alphabet[i]] = (int)i;
        }
    }
    else {
        for (i=0; i<size; ++i) {
            mapper[toupper((unsigned char)alphabet[i])] = (int)i;
            mapper[tolower((unsigned char)alphabet[i])] = (int)i;
        }
    }

    PARASAIL_CALLOC(alphabet_copy, char, size1+1);
    (void)memcpy(alphabet_copy, alphabet, sizeof(char) * size);
    alphabet_copy[size] = '*';
    alphabet_copy[size1] = '\0';

    PARASAIL_NEW(retval, parasail_matrix_t);
    retval->name = "";
    retval->matrix = matrix;
    retval->mapper = mapper;
    retval->size = (int)size1;
    retval->max = match > mismatch ? match : mismatch;
    retval->min = match > mismatch ? mismatch : match;
    retval->user_matrix = matrix;
    retval->type = PARASAIL_MATRIX_TYPE_SQUARE;
    retval->length = retval->size;
    retval->alphabet = alphabet_copy;
    retval->query = NULL;
    return retval;
}